

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack14_24(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x3fff;
  out[1] = *in >> 0xe & 0x3fff;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x1c;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0x3ff) << 4 | *puVar1;
  out[3] = *puVar2 >> 10 & 0x3fff;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x18;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x3f) << 8 | *puVar1;
  out[5] = *puVar2 >> 6 & 0x3fff;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x14;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 3) << 0xc | *puVar1;
  out[7] = *puVar2 >> 2 & 0x3fff;
  out[8] = *puVar2 >> 0x10 & 0x3fff;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x1e;
  puVar2 = in + 4;
  *puVar1 = (*puVar2 & 0xfff) << 2 | *puVar1;
  out[10] = *puVar2 >> 0xc & 0x3fff;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 0xff) << 6 | *puVar1;
  out[0xc] = *puVar2 >> 8 & 0x3fff;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x16;
  puVar2 = in + 6;
  *puVar1 = (*puVar2 & 0xf) << 10 | *puVar1;
  out[0xe] = *puVar2 >> 4 & 0x3fff;
  out[0xf] = *puVar2 >> 0x12;
  puVar1 = in + 7;
  out[0x10] = *puVar1 & 0x3fff;
  out[0x11] = *puVar1 >> 0xe & 0x3fff;
  puVar2 = out + 0x12;
  *puVar2 = *puVar1 >> 0x1c;
  puVar1 = in + 8;
  *puVar2 = (*puVar1 & 0x3ff) << 4 | *puVar2;
  out[0x13] = *puVar1 >> 10 & 0x3fff;
  puVar2 = out + 0x14;
  *puVar2 = *puVar1 >> 0x18;
  puVar1 = in + 9;
  *puVar2 = (*puVar1 & 0x3f) << 8 | *puVar2;
  out[0x15] = *puVar1 >> 6 & 0x3fff;
  puVar2 = out + 0x16;
  *puVar2 = *puVar1 >> 0x14;
  *puVar2 = (in[10] & 3) << 0xc | *puVar2;
  out[0x17] = in[10] >> 2 & 0x3fff;
  return in + 0xb;
}

Assistant:

const uint32_t *__fastunpack14_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;
  *out = ((*in) >> 16) % (1U << 14);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 12)) << (14 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 14);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 8)) << (14 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 14);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 4)) << (14 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 14);
  out++;
  *out = ((*in) >> 18);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;

  return in + 1;
}